

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O2

int __thiscall amrex::EBCellFlagFab::getNumCutCells(EBCellFlagFab *this,Box *bx_in)

{
  Box *pBVar1;
  int *piVar2;
  int iVar3;
  undefined8 uVar4;
  int i;
  _Rb_tree_color _Var5;
  long lVar6;
  iterator iVar7;
  long lVar8;
  long lVar9;
  Box bx;
  key_type kStack_b8;
  NumCells local_9c;
  pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells> local_88;
  Array4<const_amrex::EBCellFlag> local_58;
  
  iVar3 = *(int *)&(this->super_BaseFab<amrex::EBCellFlag>).field_0x44;
  kStack_b8.smallend.vect._0_8_ = *(undefined8 *)(bx_in->smallend).vect;
  uVar4 = *(undefined8 *)((bx_in->smallend).vect + 2);
  kStack_b8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx_in->bigend).vect >> 0x20);
  kStack_b8._20_8_ = *(ulong *)((bx_in->bigend).vect + 2);
  kStack_b8.smallend.vect[2] = (int)uVar4;
  kStack_b8.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    if ((kStack_b8.btype.itype >> ((uint)lVar6 & 0x1f) & 1) != 0) {
      piVar2 = kStack_b8.bigend.vect + lVar6;
      *piVar2 = *piVar2 + -1;
    }
  }
  kStack_b8._20_8_ = kStack_b8._20_8_ & 0xffffffff;
  _Var5 = _S_red;
  if (1 < iVar3 + 1U) {
    iVar7 = std::
            _Rb_tree<amrex::Box,_std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>,_std::_Select1st<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
            ::find(&(this->m_typemap)._M_t,&kStack_b8);
    if ((_Rb_tree_header *)iVar7._M_node == &(this->m_typemap)._M_t._M_impl.super__Rb_tree_header) {
      local_58.p = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_58.ncomp = (this->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(this->super_BaseFab<amrex::EBCellFlag>).domain;
      local_58.begin.z = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_58.begin.x = (pBVar1->smallend).vect[0];
      local_58.begin.y = (pBVar1->smallend).vect[1];
      lVar6 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar8 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar9 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_58.jstride = (lVar8 - (pBVar1->smallend).vect[0]) + 1;
      local_58.kstride =
           (lVar6 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           local_58.jstride;
      local_58.nstride = (lVar9 - local_58.begin.z) * local_58.kstride;
      local_58.end._0_8_ = lVar8 + 1U & 0xffffffff | lVar6 << 0x20;
      local_58.end.z = (int)lVar9;
      anon_unknown_27::countCells(&local_9c,&local_58,&kStack_b8);
      local_88.first.bigend.vect[1] = kStack_b8.bigend.vect[1];
      local_88.first.bigend.vect[2] = kStack_b8.bigend.vect[2];
      local_88.first.btype.itype = kStack_b8.btype.itype;
      local_88.first.smallend.vect[0] = kStack_b8.smallend.vect[0];
      local_88.first.smallend.vect[1] = kStack_b8.smallend.vect[1];
      local_88.first.smallend.vect[2] = kStack_b8.smallend.vect[2];
      local_88.first.bigend.vect[0] = kStack_b8.bigend.vect[0];
      local_88.second.nmulti = local_9c.nmulti;
      local_88.second.ncovered = local_9c.ncovered;
      local_88.second.type = local_9c.type;
      std::
      _Rb_tree<amrex::Box,std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>,std::_Select1st<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>,std::less<amrex::Box>,std::allocator<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>>
      ::_M_insert_unique<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>
                ((_Rb_tree<amrex::Box,std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>,std::_Select1st<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>,std::less<amrex::Box>,std::allocator<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>>
                  *)&this->m_typemap,&local_88);
      _Var5 = local_9c.nsingle;
    }
    else {
      _Var5 = iVar7._M_node[2]._M_color;
    }
  }
  return _Var5;
}

Assistant:

int
EBCellFlagFab::getNumCutCells (const Box& bx_in) const noexcept
{
    FabType thistype = getType();

    const Box& bx = amrex::enclosedCells(bx_in);

    if (thistype == FabType::regular)
    {
        return 0;
    }
    else if (thistype == FabType::covered)
    {
        return 0;
    }
    else
    {
        std::map<Box,NumCells>::iterator it;
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
        it = m_typemap.find(bx);
        if (it != m_typemap.end())
        {
            return it->second.nsingle;
        }
        else
        {
            auto const& flag = this->const_array();
            auto const& t = countCells(flag, bx);

#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
            m_typemap.insert({bx,t});

            return t.nsingle;
        }
    }
}